

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_hmac_finish_internal(psa_hmac_internal_data *hmac,uint8_t *mac,size_t mac_size)

{
  uint uVar1;
  psa_algorithm_t alg;
  psa_status_t pVar2;
  size_t input_length;
  size_t hash_size;
  uint8_t tmp [64];
  size_t local_80;
  uint8_t local_78 [72];
  
  alg = (hmac->hash_ctx).alg;
  local_80 = 0;
  uVar1 = alg + 0xfeffffff;
  if (uVar1 < 0xb) {
    input_length = *(size_t *)(&DAT_0013e490 + (ulong)uVar1 * 8);
  }
  else {
    input_length = 0;
  }
  pVar2 = psa_hash_finish(&hmac->hash_ctx,local_78,0x40,&local_80);
  if (pVar2 == 0) {
    pVar2 = psa_hash_setup(&hmac->hash_ctx,alg);
    if ((((pVar2 == 0) &&
         (pVar2 = psa_hash_update(&hmac->hash_ctx,hmac->opad,input_length), pVar2 == 0)) &&
        (pVar2 = psa_hash_update(&hmac->hash_ctx,local_78,local_80), pVar2 == 0)) &&
       (pVar2 = psa_hash_finish(&hmac->hash_ctx,local_78,0x40,&local_80), pVar2 == 0)) {
      memcpy(mac,local_78,mac_size);
      pVar2 = 0;
    }
    mbedtls_platform_zeroize(local_78,local_80);
  }
  return pVar2;
}

Assistant:

static psa_status_t psa_hmac_finish_internal( psa_hmac_internal_data *hmac,
                                              uint8_t *mac,
                                              size_t mac_size )
{
    uint8_t tmp[MBEDTLS_MD_MAX_SIZE];
    psa_algorithm_t hash_alg = hmac->hash_ctx.alg;
    size_t hash_size = 0;
    size_t block_size = psa_get_hash_block_size( hash_alg );
    psa_status_t status;

    status = psa_hash_finish( &hmac->hash_ctx, tmp, sizeof( tmp ), &hash_size );
    if( status != PSA_SUCCESS )
        return( status );
    /* From here on, tmp needs to be wiped. */

    status = psa_hash_setup( &hmac->hash_ctx, hash_alg );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_hash_update( &hmac->hash_ctx, hmac->opad, block_size );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_hash_update( &hmac->hash_ctx, tmp, hash_size );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_hash_finish( &hmac->hash_ctx, tmp, sizeof( tmp ), &hash_size );
    if( status != PSA_SUCCESS )
        goto exit;

    memcpy( mac, tmp, mac_size );

exit:
    mbedtls_platform_zeroize( tmp, hash_size );
    return( status );
}